

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bracket_notation_parser_impl.h
# Opt level: O3

void __thiscall
parser::BracketNotationParser<label::StringLabel>::parse_collection
          (BracketNotationParser<label::StringLabel> *this,
          vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
          *trees_collection,string *file_path)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  istream *piVar4;
  runtime_error *this_00;
  long *plVar5;
  pointer pNVar6;
  string tree_string;
  ifstream trees_file;
  undefined1 auStack_298 [8];
  string local_290;
  undefined1 local_270 [24];
  _Alloc_hider _Stack_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [2];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(string *)file_path,_S_in);
  lVar3 = *(long *)(local_238[0]._M_allocated_capacity - 0x18);
  if ((abStack_218[lVar3] & 5) == 0) {
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    local_290._M_string_length = 0;
    local_290.field_2._M_local_buf[0] = '\0';
    while( true ) {
      cVar1 = std::ios::widen((char)auStack_298 + (char)lVar3 + '`');
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_238[0]._M_local_buf,(string *)&local_290,cVar1);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      bVar2 = validate_input(this,&local_290);
      if (bVar2) {
        parse_single((Node<label::StringLabel> *)local_270,this,&local_290);
        std::vector<node::Node<label::StringLabel>,std::allocator<node::Node<label::StringLabel>>>::
        emplace_back<node::Node<label::StringLabel>>
                  ((vector<node::Node<label::StringLabel>,std::allocator<node::Node<label::StringLabel>>>
                    *)trees_collection,(Node<label::StringLabel> *)local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_258._M_p != &local_248) {
          operator_delete(_Stack_258._M_p,local_248._M_allocated_capacity + 1);
        }
        std::
        vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>::
        ~vector((vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                 *)local_270);
      }
      lVar3 = *(long *)(local_238[0]._M_allocated_capacity - 0x18);
    }
    std::ifstream::close();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,
                      CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                               local_290.field_2._M_local_buf[0]) + 1);
    }
    std::ifstream::~ifstream(local_238);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_290,"ERROR: Problem with opening the file \'",file_path);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_290);
  local_270._0_8_ = *plVar5;
  pNVar6 = (pointer)(plVar5 + 2);
  if ((pointer)local_270._0_8_ == pNVar6) {
    local_270._16_8_ =
         (pNVar6->children_).
         super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    _Stack_258._M_p = (pointer)plVar5[3];
    local_270._0_8_ = (pointer)(local_270 + 0x10);
  }
  else {
    local_270._16_8_ =
         (pNVar6->children_).
         super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  local_270._8_8_ = plVar5[1];
  *plVar5 = (long)pNVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)local_270);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BracketNotationParser<Label>::parse_collection(
    std::vector<node::Node<Label>>& trees_collection,
    const std::string& file_path) {
  std::ifstream trees_file(file_path);
  if (!trees_file) {
    throw std::runtime_error("ERROR: Problem with opening the file '" + file_path + "' in BracketNotationParser::parse_collection_efficient.");
  }
  // Read the trees line by line, parse, and move into the container.
  std::string tree_string;
  while (std::getline(trees_file, tree_string)) {
    if (!validate_input(tree_string)) {
      continue;
    }
    trees_collection.push_back(parse_single(tree_string)); // -> This invokes a move constructor (due to push_back(<rvalue>)).
  }
  trees_file.close();
}